

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void luaG_runerror(lua_State *L,char *fmt,...)

{
  CallInfo *ci_00;
  TString *src;
  char in_AL;
  int line;
  char *msg_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list argp;
  char *msg;
  CallInfo *ci;
  char *fmt_local;
  lua_State *L_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ci_00 = L->ci;
  argp[0].overflow_arg_area = local_f8;
  argp[0]._0_8_ = &stack0x00000008;
  local_48._4_4_ = 0x30;
  local_48._0_4_ = 0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  msg_00 = luaO_pushvfstring(L,fmt,(__va_list_tag *)local_48);
  if ((ci_00->callstatus & 2) != 0) {
    src = *(TString **)(*(long *)((ci_00->func->value_).f + 0x18) + 0x68);
    line = currentline(ci_00);
    luaG_addinfo(L,msg_00,src,line);
  }
  luaG_errormsg(L);
}

Assistant:

l_noret luaG_runerror(lua_State *L, const char *fmt, ...) {
    CallInfo *ci = L->ci;
    const char *msg;
    va_list argp;
    va_start(argp, fmt);
    msg = luaO_pushvfstring(L, fmt, argp);  /* format message */
    va_end(argp);
    if (isLua(ci))  /* if Lua function, add source:line information */
        luaG_addinfo(L, msg, ci_func(ci)->p->source, currentline(ci));
    luaG_errormsg(L);
}